

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O0

bool ParseFixedPoint(string_view val,int decimals,int64_t *amount_out)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  const_reference pvVar7;
  long lVar8;
  undefined8 *in_RCX;
  int in_EDX;
  long in_FS_OFFSET;
  int i;
  int point_ofs;
  int end;
  int ptr;
  bool exponent_sign;
  bool mantissa_sign;
  int64_t exponent;
  int mantissa_tzeros;
  int64_t mantissa;
  undefined7 in_stack_ffffffffffffff98;
  char in_stack_ffffffffffffff9f;
  int64_t *in_stack_ffffffffffffffa0;
  byte in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffa9;
  undefined1 in_stack_ffffffffffffffaa;
  undefined1 in_stack_ffffffffffffffab;
  undefined2 in_stack_ffffffffffffffac;
  undefined2 uVar9;
  char in_stack_ffffffffffffffae;
  undefined1 uVar10;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 uVar11;
  int local_50;
  int local_48;
  long local_40;
  bool local_25;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = 0;
  bVar2 = false;
  local_48 = 0;
  sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  iVar5 = (int)sVar6;
  local_50 = 0;
  if ((0 < iVar5) &&
     (pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          CONCAT17(in_stack_ffffffffffffffaf,
                                   CONCAT16(in_stack_ffffffffffffffae,
                                            CONCAT24(in_stack_ffffffffffffffac,
                                                     CONCAT13(in_stack_ffffffffffffffab,
                                                              CONCAT12(in_stack_ffffffffffffffaa,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffffa9,
                                                  in_stack_ffffffffffffffa8)))))),
                          (size_type)in_stack_ffffffffffffffa0), *pvVar7 == '-')) {
    local_48 = 1;
  }
  if (local_48 < iVar5) {
    pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)
                        CONCAT17(in_stack_ffffffffffffffaf,
                                 CONCAT16(in_stack_ffffffffffffffae,
                                          CONCAT24(in_stack_ffffffffffffffac,
                                                   CONCAT13(in_stack_ffffffffffffffab,
                                                            CONCAT12(in_stack_ffffffffffffffaa,
                                                                     CONCAT11(
                                                  in_stack_ffffffffffffffa9,
                                                  in_stack_ffffffffffffffa8)))))),
                        (size_type)in_stack_ffffffffffffffa0);
    if (*pvVar7 == '0') {
      local_48 = local_48 + 1;
LAB_00361974:
      if ((local_48 < iVar5) &&
         (pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)
                              CONCAT17(in_stack_ffffffffffffffaf,
                                       CONCAT16(in_stack_ffffffffffffffae,
                                                CONCAT24(in_stack_ffffffffffffffac,
                                                         CONCAT13(in_stack_ffffffffffffffab,
                                                                  CONCAT12(in_stack_ffffffffffffffaa
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffffa9,
                                                  in_stack_ffffffffffffffa8)))))),
                              (size_type)in_stack_ffffffffffffffa0), *pvVar7 == '.')) {
        local_48 = local_48 + 1;
        if (local_48 < iVar5) {
          std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_ffffffffffffffaf,
                              CONCAT16(in_stack_ffffffffffffffae,
                                       CONCAT24(in_stack_ffffffffffffffac,
                                                CONCAT13(in_stack_ffffffffffffffab,
                                                         CONCAT12(in_stack_ffffffffffffffaa,
                                                                  CONCAT11(in_stack_ffffffffffffffa9
                                                                           ,
                                                  in_stack_ffffffffffffffa8)))))),
                     (size_type)in_stack_ffffffffffffffa0);
          bVar3 = IsDigit(in_stack_ffffffffffffff9f);
          if (bVar3) {
            while( true ) {
              bVar3 = false;
              if (local_48 < iVar5) {
                std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT17(in_stack_ffffffffffffffaf,
                                    CONCAT16(in_stack_ffffffffffffffae,
                                             CONCAT24(in_stack_ffffffffffffffac,
                                                      CONCAT13(in_stack_ffffffffffffffab,
                                                               (uint3)CONCAT11(
                                                  in_stack_ffffffffffffffa9,
                                                  in_stack_ffffffffffffffa8))))),
                           (size_type)in_stack_ffffffffffffffa0);
                bVar3 = IsDigit(in_stack_ffffffffffffff9f);
              }
              if (bVar3 == false) {
                in_stack_ffffffffffffffaa = 0;
                goto LAB_00361a6e;
              }
              std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT17(in_stack_ffffffffffffffaf,
                                  CONCAT16(in_stack_ffffffffffffffae,
                                           CONCAT24(in_stack_ffffffffffffffac,
                                                    CONCAT13(in_stack_ffffffffffffffab,
                                                             CONCAT12(bVar3,CONCAT11(
                                                  in_stack_ffffffffffffffa9,
                                                  in_stack_ffffffffffffffa8)))))),
                         (size_type)in_stack_ffffffffffffffa0);
              bVar3 = ProcessMantissaDigit
                                (in_stack_ffffffffffffffae,in_stack_ffffffffffffffa0,
                                 (int *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98
                                                ));
              if (!bVar3) break;
              local_48 = local_48 + 1;
              local_50 = local_50 + 1;
            }
            local_25 = false;
            goto LAB_00361d09;
          }
        }
        local_25 = false;
      }
      else {
LAB_00361a6e:
        if ((local_48 < iVar5) &&
           ((pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 CONCAT17(in_stack_ffffffffffffffaf,
                                          CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            CONCAT13(in_stack_ffffffffffffffab,
                                                                     CONCAT12(
                                                  in_stack_ffffffffffffffaa,
                                                  CONCAT11(in_stack_ffffffffffffffa9,
                                                           in_stack_ffffffffffffffa8)))))),
                                 (size_type)in_stack_ffffffffffffffa0), *pvVar7 == 'e' ||
            (pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 CONCAT17(in_stack_ffffffffffffffaf,
                                          CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            CONCAT13(in_stack_ffffffffffffffab,
                                                                     CONCAT12(
                                                  in_stack_ffffffffffffffaa,
                                                  CONCAT11(in_stack_ffffffffffffffa9,
                                                           in_stack_ffffffffffffffa8)))))),
                                 (size_type)in_stack_ffffffffffffffa0), *pvVar7 == 'E')))) {
          iVar4 = local_48 + 1;
          if ((iVar4 < iVar5) &&
             (pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                 ((basic_string_view<char,_std::char_traits<char>_> *)
                                  CONCAT17(in_stack_ffffffffffffffaf,
                                           CONCAT16(in_stack_ffffffffffffffae,
                                                    CONCAT24(in_stack_ffffffffffffffac,
                                                             CONCAT13(in_stack_ffffffffffffffab,
                                                                      CONCAT12(
                                                  in_stack_ffffffffffffffaa,
                                                  CONCAT11(in_stack_ffffffffffffffa9,
                                                           in_stack_ffffffffffffffa8)))))),
                                  (size_type)in_stack_ffffffffffffffa0), *pvVar7 == '+')) {
            iVar4 = local_48 + 2;
          }
          else if ((iVar4 < iVar5) &&
                  (pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                      ((basic_string_view<char,_std::char_traits<char>_> *)
                                       CONCAT17(in_stack_ffffffffffffffaf,
                                                CONCAT16(in_stack_ffffffffffffffae,
                                                         CONCAT24(in_stack_ffffffffffffffac,
                                                                  CONCAT13(in_stack_ffffffffffffffab
                                                                           ,CONCAT12(
                                                  in_stack_ffffffffffffffaa,
                                                  CONCAT11(in_stack_ffffffffffffffa9,
                                                           in_stack_ffffffffffffffa8)))))),
                                       (size_type)in_stack_ffffffffffffffa0), *pvVar7 == '-')) {
            bVar2 = true;
            iVar4 = local_48 + 2;
          }
          local_48 = iVar4;
          if (local_48 < iVar5) {
            std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT17(in_stack_ffffffffffffffaf,
                                CONCAT16(in_stack_ffffffffffffffae,
                                         CONCAT24(in_stack_ffffffffffffffac,
                                                  CONCAT13(in_stack_ffffffffffffffab,
                                                           CONCAT12(in_stack_ffffffffffffffaa,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffa9,
                                                  in_stack_ffffffffffffffa8)))))),
                       (size_type)in_stack_ffffffffffffffa0);
            bVar3 = IsDigit(in_stack_ffffffffffffff9f);
            if (bVar3) {
              while( true ) {
                bVar3 = false;
                if (local_48 < iVar5) {
                  std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             CONCAT17(in_stack_ffffffffffffffaf,
                                      CONCAT16(in_stack_ffffffffffffffae,
                                               CONCAT24(in_stack_ffffffffffffffac,
                                                        CONCAT13(in_stack_ffffffffffffffab,
                                                                 CONCAT12(in_stack_ffffffffffffffaa,
                                                                          (ushort)
                                                  in_stack_ffffffffffffffa8))))),
                             (size_type)in_stack_ffffffffffffffa0);
                  bVar3 = IsDigit(in_stack_ffffffffffffff9f);
                }
                if (bVar3 == false) goto LAB_00361bea;
                if (99999999999999999 < local_40) break;
                in_stack_ffffffffffffffa0 = (int64_t *)(local_40 * 10);
                pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                   ((basic_string_view<char,_std::char_traits<char>_> *)
                                    CONCAT17(in_stack_ffffffffffffffaf,
                                             CONCAT16(in_stack_ffffffffffffffae,
                                                      CONCAT24(in_stack_ffffffffffffffac,
                                                               CONCAT13(in_stack_ffffffffffffffab,
                                                                        CONCAT12(
                                                  in_stack_ffffffffffffffaa,
                                                  CONCAT11(bVar3,in_stack_ffffffffffffffa8)))))),
                                    (size_type)in_stack_ffffffffffffffa0);
                local_40 = (long)in_stack_ffffffffffffffa0 + (long)*pvVar7 + -0x30;
                local_48 = local_48 + 1;
              }
              local_25 = false;
              goto LAB_00361d09;
            }
          }
          local_25 = false;
        }
        else {
LAB_00361bea:
          if (local_48 == iVar5) {
            if (bVar2) {
              local_40 = -local_40;
            }
            lVar8 = (long)in_EDX + (local_40 - local_50);
            if (lVar8 < 0) {
              local_25 = false;
            }
            else if (lVar8 < 0x12) {
              uVar9 = 0;
              uVar10 = 0;
              uVar11 = 0;
              while (CONCAT13(uVar11,CONCAT12(uVar10,uVar9)) < lVar8) {
                iVar5 = CONCAT13(uVar11,CONCAT12(uVar10,uVar9)) + 1;
                uVar9 = (undefined2)iVar5;
                uVar10 = (undefined1)((uint)iVar5 >> 0x10);
                uVar11 = (undefined1)((uint)iVar5 >> 0x18);
              }
              if (in_RCX != (undefined8 *)0x0) {
                *in_RCX = 0;
              }
              local_25 = true;
            }
            else {
              local_25 = false;
            }
          }
          else {
            local_25 = false;
          }
        }
      }
    }
    else {
      pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          CONCAT17(in_stack_ffffffffffffffaf,
                                   CONCAT16(in_stack_ffffffffffffffae,
                                            CONCAT24(in_stack_ffffffffffffffac,
                                                     CONCAT13(in_stack_ffffffffffffffab,
                                                              CONCAT12(in_stack_ffffffffffffffaa,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffffa9,
                                                  in_stack_ffffffffffffffa8)))))),
                          (size_type)in_stack_ffffffffffffffa0);
      if ((*pvVar7 < '1') ||
         (pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)
                              CONCAT17(in_stack_ffffffffffffffaf,
                                       CONCAT16(in_stack_ffffffffffffffae,
                                                CONCAT24(in_stack_ffffffffffffffac,
                                                         CONCAT13(in_stack_ffffffffffffffab,
                                                                  CONCAT12(in_stack_ffffffffffffffaa
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffffa9,
                                                  in_stack_ffffffffffffffa8)))))),
                              (size_type)in_stack_ffffffffffffffa0), '9' < *pvVar7)) {
        local_25 = false;
      }
      else {
        while( true ) {
          bVar3 = false;
          if (local_48 < iVar5) {
            std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT17(in_stack_ffffffffffffffaf,
                                CONCAT16(in_stack_ffffffffffffffae,
                                         CONCAT24(in_stack_ffffffffffffffac,
                                                  (uint)CONCAT12(in_stack_ffffffffffffffaa,
                                                                 CONCAT11(in_stack_ffffffffffffffa9,
                                                                          in_stack_ffffffffffffffa8)
                                                                )))),
                       (size_type)in_stack_ffffffffffffffa0);
            bVar3 = IsDigit(in_stack_ffffffffffffff9f);
          }
          if (bVar3 == false) {
            in_stack_ffffffffffffffab = 0;
            goto LAB_00361974;
          }
          std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_ffffffffffffffaf,
                              CONCAT16(in_stack_ffffffffffffffae,
                                       CONCAT24(in_stack_ffffffffffffffac,
                                                CONCAT13(bVar3,CONCAT12(in_stack_ffffffffffffffaa,
                                                                        CONCAT11(
                                                  in_stack_ffffffffffffffa9,
                                                  in_stack_ffffffffffffffa8)))))),
                     (size_type)in_stack_ffffffffffffffa0);
          bVar3 = ProcessMantissaDigit
                            (in_stack_ffffffffffffffae,in_stack_ffffffffffffffa0,
                             (int *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
          if (!bVar3) break;
          local_48 = local_48 + 1;
        }
        local_25 = false;
      }
    }
  }
  else {
    local_25 = false;
  }
LAB_00361d09:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_25;
}

Assistant:

bool ParseFixedPoint(std::string_view val, int decimals, int64_t *amount_out)
{
    int64_t mantissa = 0;
    int64_t exponent = 0;
    int mantissa_tzeros = 0;
    bool mantissa_sign = false;
    bool exponent_sign = false;
    int ptr = 0;
    int end = val.size();
    int point_ofs = 0;

    if (ptr < end && val[ptr] == '-') {
        mantissa_sign = true;
        ++ptr;
    }
    if (ptr < end)
    {
        if (val[ptr] == '0') {
            /* pass single 0 */
            ++ptr;
        } else if (val[ptr] >= '1' && val[ptr] <= '9') {
            while (ptr < end && IsDigit(val[ptr])) {
                if (!ProcessMantissaDigit(val[ptr], mantissa, mantissa_tzeros))
                    return false; /* overflow */
                ++ptr;
            }
        } else return false; /* missing expected digit */
    } else return false; /* empty string or loose '-' */
    if (ptr < end && val[ptr] == '.')
    {
        ++ptr;
        if (ptr < end && IsDigit(val[ptr]))
        {
            while (ptr < end && IsDigit(val[ptr])) {
                if (!ProcessMantissaDigit(val[ptr], mantissa, mantissa_tzeros))
                    return false; /* overflow */
                ++ptr;
                ++point_ofs;
            }
        } else return false; /* missing expected digit */
    }
    if (ptr < end && (val[ptr] == 'e' || val[ptr] == 'E'))
    {
        ++ptr;
        if (ptr < end && val[ptr] == '+')
            ++ptr;
        else if (ptr < end && val[ptr] == '-') {
            exponent_sign = true;
            ++ptr;
        }
        if (ptr < end && IsDigit(val[ptr])) {
            while (ptr < end && IsDigit(val[ptr])) {
                if (exponent > (UPPER_BOUND / 10LL))
                    return false; /* overflow */
                exponent = exponent * 10 + val[ptr] - '0';
                ++ptr;
            }
        } else return false; /* missing expected digit */
    }
    if (ptr != end)
        return false; /* trailing garbage */

    /* finalize exponent */
    if (exponent_sign)
        exponent = -exponent;
    exponent = exponent - point_ofs + mantissa_tzeros;

    /* finalize mantissa */
    if (mantissa_sign)
        mantissa = -mantissa;

    /* convert to one 64-bit fixed-point value */
    exponent += decimals;
    if (exponent < 0)
        return false; /* cannot represent values smaller than 10^-decimals */
    if (exponent >= 18)
        return false; /* cannot represent values larger than or equal to 10^(18-decimals) */

    for (int i=0; i < exponent; ++i) {
        if (mantissa > (UPPER_BOUND / 10LL) || mantissa < -(UPPER_BOUND / 10LL))
            return false; /* overflow */
        mantissa *= 10;
    }
    if (mantissa > UPPER_BOUND || mantissa < -UPPER_BOUND)
        return false; /* overflow */

    if (amount_out)
        *amount_out = mantissa;

    return true;
}